

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::StyledWriter::isMultineArray(StyledWriter *this,Value *value)

{
  CommentInfo *pCVar1;
  bool bVar2;
  ArrayIndex AVar3;
  ArrayIndex AVar4;
  Value *pVVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  byte local_34;
  
  AVar3 = Value::size(value);
  bVar9 = this->rightMargin_ <= AVar3 * 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  if (AVar3 != 0 && !bVar9) {
    uVar6 = 1;
    do {
      pVVar5 = Value::operator[](value,uVar6 - 1);
      if ((*(ushort *)&pVVar5->field_0x8 & 0xfe) == 6) {
        AVar4 = Value::size(pVVar5);
        bVar9 = AVar4 != 0;
      }
      else {
        bVar9 = false;
      }
    } while ((uVar6 < AVar3) && (uVar6 = uVar6 + 1, !bVar9));
  }
  bVar2 = true;
  if (!bVar9) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(ulong)AVar3);
    this->addChildValues_ = true;
    uVar6 = AVar3 * 2 + 2;
    if (AVar3 == 0) {
      local_34 = 0;
    }
    else {
      lVar7 = 8;
      uVar8 = 0;
      local_34 = 0;
      do {
        pVVar5 = Value::operator[](value,(ArrayIndex)uVar8);
        pCVar1 = pVVar5->comments_;
        if ((pCVar1 != (CommentInfo *)0x0) &&
           (((pCVar1->comment_ != (char *)0x0 || (pCVar1[1].comment_ != (char *)0x0)) ||
            (pCVar1[2].comment_ != (char *)0x0)))) {
          local_34 = 1;
        }
        pVVar5 = Value::operator[](value,(ArrayIndex)uVar8);
        writeValue(this,pVVar5);
        uVar6 = uVar6 + *(int *)((long)&(((this->childValues_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar7);
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x20;
      } while (AVar3 != uVar8);
    }
    this->addChildValues_ = false;
    bVar2 = (bool)(this->rightMargin_ <= uVar6 | local_34);
  }
  return bVar2;
}

Assistant:

bool StyledWriter::isMultineArray(const Value& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}